

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_buf.cpp
# Opt level: O2

int __thiscall InputBuffer::read_from_fd(InputBuffer *this,int fd)

{
  uint __line;
  int iVar1;
  Mempool *pMVar2;
  Chunk *pCVar3;
  ssize_t sVar4;
  int *piVar5;
  EVP_PKEY_CTX *src;
  char *__format;
  char *pcVar6;
  undefined8 uStack_40;
  int need_read;
  
  iVar1 = ioctl(fd,0x541b,&need_read);
  if (iVar1 == -1) {
    if (pr_level < 0) {
      return -1;
    }
    __format = "[%-5s][%s:%d] ioctl FIONREAD error\n";
    pcVar6 = "error";
    uStack_40 = 0x30;
LAB_0010eb10:
    printf(__format,pcVar6,"read_from_fd",uStack_40);
  }
  else {
    pCVar3 = (this->super_BufferBase).data_buf;
    if (pCVar3 == (Chunk *)0x0) {
      pMVar2 = Mempool::get_instance();
      pCVar3 = Mempool::alloc_chunk(pMVar2,need_read);
      (this->super_BufferBase).data_buf = pCVar3;
      if (pCVar3 == (Chunk *)0x0) {
        if (pr_level < 2) {
          return -1;
        }
        __format = "[%-5s][%s:%d] no free buf for alloc\n";
        pcVar6 = "info";
        uStack_40 = 0x37;
        goto LAB_0010eb10;
      }
    }
    else {
      if (pCVar3->head != 0) {
        pcVar6 = "data_buf->head == 0";
        __line = 0x3c;
LAB_0010ec2e:
        __assert_fail(pcVar6,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/data_buf.cpp"
                      ,__line,"int InputBuffer::read_from_fd(int)");
      }
      if (pCVar3->capacity - pCVar3->length < need_read) {
        pMVar2 = Mempool::get_instance();
        pCVar3 = Mempool::alloc_chunk
                           (pMVar2,((this->super_BufferBase).data_buf)->length + need_read);
        if (pCVar3 == (Chunk *)0x0) {
          if (pr_level < 2) {
            return -1;
          }
          __format = "[%-5s][%s:%d] no free buf for alloc\n";
          pcVar6 = "info";
          uStack_40 = 0x40;
          goto LAB_0010eb10;
        }
        Chunk::copy(pCVar3,(EVP_PKEY_CTX *)(this->super_BufferBase).data_buf,src);
        pMVar2 = Mempool::get_instance();
        Mempool::retrieve(pMVar2,(this->super_BufferBase).data_buf);
        (this->super_BufferBase).data_buf = pCVar3;
      }
    }
    do {
      pCVar3 = (this->super_BufferBase).data_buf;
      iVar1 = need_read;
      if (need_read == 0) {
        iVar1 = 0x1000;
      }
      sVar4 = read(fd,pCVar3->data + pCVar3->length,(long)iVar1);
      iVar1 = (int)sVar4;
      if (iVar1 != -1) {
        if (iVar1 < 1) {
          return iVar1;
        }
        if ((need_read == 0) || (need_read == iVar1)) {
          piVar5 = &((this->super_BufferBase).data_buf)->length;
          *piVar5 = *piVar5 + iVar1;
          return iVar1;
        }
        pcVar6 = "already_read == need_read";
        __line = 0x53;
        goto LAB_0010ec2e;
      }
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
  }
  return -1;
}

Assistant:

int InputBuffer::read_from_fd(int fd)
{
    int need_read;
    // FIONREAD: get readable bytes num in kernel buffer
    if (ioctl(fd, FIONREAD, &need_read) == -1) {
        PR_ERROR("ioctl FIONREAD error\n");
        return -1;
    }
    
    if (data_buf == nullptr) {
        data_buf = Mempool::get_instance().alloc_chunk(need_read);
        if (data_buf == nullptr) {
            PR_INFO("no free buf for alloc\n");
            return -1;
        }
    }
    else {
        assert(data_buf->head == 0);
        if (data_buf->capacity - data_buf->length < (int)need_read) {   
            Chunk *new_buf = Mempool::get_instance().alloc_chunk(need_read + data_buf->length);
            if (new_buf == nullptr) {
                PR_INFO("no free buf for alloc\n");
                return -1;
            }
            new_buf->copy(data_buf);
            Mempool::get_instance().retrieve(data_buf);
            data_buf = new_buf;
        }
    }

    int already_read = 0;
    do { 
        if(need_read == 0) {
            already_read = read(fd, data_buf->data + data_buf->length, m4K);
        } else {
            already_read = read(fd, data_buf->data + data_buf->length, need_read);
        }
    } while (already_read == -1 && errno == EINTR);
    if (already_read > 0)  {
        if (need_read != 0) {
            assert(already_read == need_read);
        }
        data_buf->length += already_read;
    }

    return already_read;
}